

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

int fio_glob_match(fio_str_info_s pat,fio_str_info_s ch)

{
  byte bVar1;
  byte bVar2;
  size_t sVar3;
  size_t sVar4;
  byte *pbVar5;
  size_t sVar6;
  size_t sVar7;
  byte *pbVar8;
  bool local_5d;
  byte local_42;
  byte local_41;
  uint8_t tmp;
  uint8_t b;
  byte *pbStack_40;
  uint8_t a;
  uint8_t *cls;
  uint8_t inverted;
  uint8_t match;
  uint8_t d;
  size_t sStack_30;
  uint8_t c;
  size_t back_str_len;
  size_t back_pat_len;
  uint8_t *back_str;
  uint8_t *back_pat;
  
  back_str = (uint8_t *)0x0;
  back_pat_len = ch.len;
  back_str_len = 0;
  sStack_30 = ch.capa;
  do {
    while( true ) {
      do {
        while( true ) {
          sVar3 = pat.capa;
          if (ch.capa == 0) {
            return (uint)((pat.capa != 0 ^ 0xffU) & 1);
          }
          sVar7 = ch.len + 1;
          bVar1 = *(byte *)ch.len;
          pbVar8 = (byte *)(pat.len + 1);
          cls._6_1_ = *(byte *)pat.len;
          sVar6 = ch.capa - 1;
          sVar4 = pat.capa - 1;
          pat.capa = sVar4;
          if (cls._6_1_ != 0x2a) break;
          if (sVar4 == 0) {
            return 1;
          }
          back_pat_len = ch.len;
          sStack_30 = ch.capa;
          back_str_len = sVar4;
          back_str = pbVar8;
        }
        ch.capa = sVar6;
        ch.len = sVar7;
      } while (cls._6_1_ == 0x3f);
      if (cls._6_1_ == 0x5b) break;
      if (cls._6_1_ == 0x5c) {
        cls._6_1_ = *pbVar8;
        pat.capa = sVar3 - 2;
      }
      if (bVar1 != cls._6_1_) {
LAB_00146fd4:
        if (back_str == (uint8_t *)0x0) {
          return 0;
        }
        back_pat_len = back_pat_len + 1;
        sStack_30 = sStack_30 - 1;
        pat.capa = back_str_len;
        ch.capa = sStack_30;
        ch.len = back_pat_len;
      }
    }
    cls._5_1_ = false;
    local_41 = pbVar8[(int)(uint)(*pbVar8 == 0x5e)];
    pbStack_40 = pbVar8 + (int)(uint)(*pbVar8 == 0x5e) + 1;
    do {
      local_42 = local_41;
      if ((*pbStack_40 == 0x2d) && (pbStack_40[1] != 0x5d)) {
        bVar2 = pbStack_40[1];
        pbStack_40 = pbStack_40 + 2;
        local_42 = bVar2;
        if (bVar2 < local_41) {
          local_42 = local_41;
          local_41 = bVar2;
        }
      }
      local_5d = local_41 <= bVar1 && bVar1 <= local_42;
      cls._5_1_ = (bool)(cls._5_1_ | local_5d);
      pbVar5 = pbStack_40 + 1;
      local_41 = *pbStack_40;
      pbStack_40 = pbVar5;
    } while (local_41 != 0x5d);
    if (cls._5_1_ == (*pbVar8 == 0x5e)) goto LAB_00146fd4;
    pat.capa = sVar4 - ((long)pbVar5 - (long)pbVar8);
  } while( true );
}

Assistant:

static int fio_glob_match(fio_str_info_s pat, fio_str_info_s ch) {
  /* adapted and rewritten, with thankfulness, from the code at:
   * https://github.com/opnfv/kvmfornfv/blob/master/kernel/lib/glob.c
   *
   * Original version's copyright:
   * Copyright 2015 Open Platform for NFV Project, Inc. and its contributors
   * Under the MIT license.
   */

  /*
   * Backtrack to previous * on mismatch and retry starting one
   * character later in the string.  Because * matches all characters,
   * there's never a need to backtrack multiple levels.
   */
  uint8_t *back_pat = NULL, *back_str = (uint8_t *)ch.data;
  size_t back_pat_len = 0, back_str_len = ch.len;

  /*
   * Loop over each token (character or class) in pat, matching
   * it against the remaining unmatched tail of str.  Return false
   * on mismatch, or true after matching the trailing nul bytes.
   */
  while (ch.len) {
    uint8_t c = *(uint8_t *)ch.data++;
    uint8_t d = *(uint8_t *)pat.data++;
    ch.len--;
    pat.len--;

    switch (d) {
    case '?': /* Wildcard: anything goes */
      break;

    case '*':       /* Any-length wildcard */
      if (!pat.len) /* Optimize trailing * case */
        return 1;
      back_pat = (uint8_t *)pat.data;
      back_pat_len = pat.len;
      back_str = (uint8_t *)--ch.data; /* Allow zero-length match */
      back_str_len = ++ch.len;
      break;

    case '[': { /* Character class */
      uint8_t match = 0, inverted = (*(uint8_t *)pat.data == '^');
      uint8_t *cls = (uint8_t *)pat.data + inverted;
      uint8_t a = *cls++;

      /*
       * Iterate over each span in the character class.
       * A span is either a single character a, or a
       * range a-b.  The first span may begin with ']'.
       */
      do {
        uint8_t b = a;

        if (cls[0] == '-' && cls[1] != ']') {
          b = cls[1];

          cls += 2;
          if (a > b) {
            uint8_t tmp = a;
            a = b;
            b = tmp;
          }
        }
        match |= (a <= c && c <= b);
      } while ((a = *cls++) != ']');

      if (match == inverted)
        goto backtrack;
      pat.len -= cls - (uint8_t *)pat.data;
      pat.data = (char *)cls;

    } break;
    case '\\':
      d = *(uint8_t *)pat.data++;
      pat.len--;
    /* fallthrough */
    default: /* Literal character */
      if (c == d)
        break;
    backtrack:
      if (!back_pat)
        return 0; /* No point continuing */
      /* Try again from last *, one character later in str. */
      pat.data = (char *)back_pat;
      ch.data = (char *)++back_str;
      ch.len = --back_str_len;
      pat.len = back_pat_len;
    }
  }
  return !ch.len && !pat.len;
}